

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cc
# Opt level: O3

int EditDistance(StringPiece *s1,StringPiece *s2,bool allow_replacements,int max_edit_distance)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  uint *puVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  vector<int,_std::allocator<int>_> row;
  allocator_type local_91;
  ulong local_90;
  size_t local_88;
  int local_7c;
  int *local_78;
  long local_70;
  uint *local_68;
  StringPiece *local_60;
  StringPiece *local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_90 = s1->len_;
  sVar2 = s2->len_;
  local_70 = sVar2 << 0x20;
  local_60 = s1;
  local_58 = s2;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,local_70 + 0x100000000 >> 0x20,&local_91)
  ;
  auVar6 = _DAT_001aaf90;
  auVar5 = _DAT_001aaf80;
  iVar16 = (int)sVar2;
  if (0 < iVar16) {
    uVar11 = sVar2 + 1 & 0xffffffff;
    lVar10 = uVar11 - 2;
    auVar19._8_4_ = (int)lVar10;
    auVar19._0_8_ = lVar10;
    auVar19._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar19 = auVar19 ^ _DAT_001aaf90;
    do {
      iVar7 = (int)lVar10;
      auVar20._8_4_ = iVar7;
      auVar20._0_8_ = lVar10;
      auVar20._12_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar20 = (auVar20 | auVar5) ^ auVar6;
      if ((bool)(~(auVar20._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar20._0_4_ ||
                  auVar19._4_4_ < auVar20._4_4_) & 1)) {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar10 + 1] = iVar7 + 1;
      }
      if ((auVar20._12_4_ != auVar19._12_4_ || auVar20._8_4_ <= auVar19._8_4_) &&
          auVar20._12_4_ <= auVar19._12_4_) {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar10 + 2] = iVar7 + 2;
      }
      lVar10 = lVar10 + 2;
    } while (uVar11 - ((uint)(sVar2 + 1) & 1) != lVar10);
  }
  if (0 < (int)local_90) {
    iVar7 = max_edit_distance + 1;
    local_90 = (ulong)((int)local_90 + 1);
    local_68 = (uint *)(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 1);
    uVar11 = 1;
    local_78 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      iVar9 = (int)uVar11;
      *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start = iVar9;
      if (0 < iVar16) {
        pcVar3 = local_60->str_;
        pcVar4 = local_58->str_;
        lVar10 = 0;
        uVar15 = uVar11 & 0xffffffff;
        uVar14 = uVar11 - 1 & 0xffffffff;
        uVar13 = uVar11 & 0xffffffff;
        puVar8 = local_68;
        do {
          uVar17 = (uint)uVar14;
          uVar1 = *puVar8;
          uVar14 = (ulong)uVar1;
          if (allow_replacements) {
            uVar18 = uVar17 + (pcVar3[uVar11 - 1] != pcVar4[lVar10]);
            puVar12 = puVar8 + -1;
            if ((int)uVar1 < (int)uVar15) {
              puVar12 = puVar8;
            }
            uVar17 = *puVar12 + 1;
            if ((int)uVar18 <= (int)(*puVar12 + 1)) {
              uVar17 = uVar18;
            }
          }
          else if (pcVar3[uVar11 - 1] != pcVar4[lVar10]) {
            puVar12 = puVar8 + -1;
            if ((int)uVar1 < (int)uVar15) {
              puVar12 = puVar8;
            }
            uVar17 = *puVar12 + 1;
          }
          *puVar8 = uVar17;
          if ((int)uVar17 < (int)uVar13) {
            uVar13 = (ulong)uVar17;
          }
          iVar9 = (int)uVar13;
          puVar8 = puVar8 + 1;
          lVar10 = lVar10 + 1;
          uVar15 = (ulong)uVar17;
        } while ((ulong)(iVar16 + 1) - 1 != lVar10);
      }
      local_7c = iVar7;
      local_50 = (ulong)(uint)max_edit_distance;
      if ((max_edit_distance != 0) && (max_edit_distance < iVar9)) goto LAB_00185f11;
      uVar11 = uVar11 + 1;
    } while (uVar11 != local_90);
  }
  iVar7 = *(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + (local_70 >> 0x1e));
LAB_00185f11:
  local_88 = sVar2;
  operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return iVar7;
}

Assistant:

int EditDistance(const StringPiece& s1,
                 const StringPiece& s2,
                 bool allow_replacements,
                 int max_edit_distance) {
  // The algorithm implemented below is the "classic"
  // dynamic-programming algorithm for computing the Levenshtein
  // distance, which is described here:
  //
  //   http://en.wikipedia.org/wiki/Levenshtein_distance
  //
  // Although the algorithm is typically described using an m x n
  // array, only one row plus one element are used at a time, so this
  // implementation just keeps one vector for the row.  To update one entry,
  // only the entries to the left, top, and top-left are needed.  The left
  // entry is in row[x-1], the top entry is what's in row[x] from the last
  // iteration, and the top-left entry is stored in previous.
  int m = s1.len_;
  int n = s2.len_;

  vector<int> row(n + 1);
  for (int i = 1; i <= n; ++i)
    row[i] = i;

  for (int y = 1; y <= m; ++y) {
    row[0] = y;
    int best_this_row = row[0];

    int previous = y - 1;
    for (int x = 1; x <= n; ++x) {
      int old_row = row[x];
      if (allow_replacements) {
        row[x] = min(previous + (s1.str_[y - 1] == s2.str_[x - 1] ? 0 : 1),
                     min(row[x - 1], row[x]) + 1);
      }
      else {
        if (s1.str_[y - 1] == s2.str_[x - 1])
          row[x] = previous;
        else
          row[x] = min(row[x - 1], row[x]) + 1;
      }
      previous = old_row;
      best_this_row = min(best_this_row, row[x]);
    }

    if (max_edit_distance && best_this_row > max_edit_distance)
      return max_edit_distance + 1;
  }

  return row[n];
}